

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedInterfaceResourceBasicBlockTypes
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,Storage storage,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *blockContentGenerator)

{
  deInt32 *pdVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  Node *pNVar4;
  ProgramInterface PVar5;
  SharedPtr dummyVariable;
  SharedPtr block;
  SharedPtr dummyVariable_2;
  SharedPtr binding;
  SharedPtr storageQualifier;
  SharedPtr defaultBlock;
  SharedPtr shader;
  SharedPtr program;
  SharedPtr local_d8;
  Node *local_c8;
  SharedPtrStateBase *pSStack_c0;
  MatrixOrder local_b8;
  SharedPtr local_a8;
  Node *local_98;
  SharedPtrStateBase *pSStack_90;
  Node *local_88;
  SharedPtrStateBase *pSStack_80;
  Node *local_78;
  SharedPtrStateBase *pSStack_70;
  Node *local_68;
  SharedPtrStateBase *pSStack_60;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  Context *local_48;
  TestCaseGroup *local_40;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr *local_38;
  
  local_48 = context;
  local_40 = targetGroup;
  local_38 = blockContentGenerator;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->m_type = TYPE_PROGRAM;
  (pNVar2->m_enclosingNode).m_ptr = (Node *)0x0;
  (pNVar2->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52730;
  *(undefined1 *)&pNVar2[1]._vptr_Node = 0;
  pSStack_50 = (SharedPtrStateBase *)0x0;
  local_58 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_50 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar4->m_type = TYPE_SHADER;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b527d8;
  *(undefined4 *)&pNVar4[1]._vptr_Node = 5;
  *(GLSLVersion *)((long)&pNVar4[1]._vptr_Node + 4) = glslVersion;
  pSStack_60 = (SharedPtrStateBase *)0x0;
  local_68 = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_60 = pSVar3;
  pNVar2 = (Node *)operator_new(0x20);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52810;
  pSStack_70 = (SharedPtrStateBase *)0x0;
  local_78 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_70 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar4->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52848;
  *(Storage *)&pNVar4[1]._vptr_Node = storage;
  pSStack_80 = (SharedPtrStateBase *)0x0;
  local_88 = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_80 = pSVar3;
  pNVar2 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)&local_c8,-1,1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52a10;
  pNVar2[1]._vptr_Node = (_func_int **)local_c8;
  *(SharedPtrStateBase **)&pNVar2[1].m_type = pSStack_c0;
  *(MatrixOrder *)&pNVar2[1].m_enclosingNode.m_ptr = local_b8;
  pSStack_90 = (SharedPtrStateBase *)0x0;
  local_98 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  PVar5 = PROGRAMINTERFACE_SHADER_STORAGE_BLOCK;
  if (storage == STORAGE_UNIFORM) {
    PVar5 = PROGRAMINTERFACE_UNIFORM_BLOCK;
  }
  pSStack_90 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar4->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar4[1]._vptr_Node = 1;
  pSStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_c0 = pSVar3;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0x25;
  local_d8.m_state = (SharedPtrStateBase *)0x0;
  local_d8.m_ptr = pNVar2;
  local_d8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_d8.m_state)->strongRefCount = 0;
  (local_d8.m_state)->weakRefCount = 0;
  (local_d8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  local_d8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  (local_d8.m_state)->strongRefCount = 1;
  (local_d8.m_state)->weakRefCount = 1;
  (*local_38)(local_48,&local_d8,local_40,PVar5,"named_block");
  if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.m_ptr = (Node *)0x0;
      (*(local_d8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_d8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_d8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_c0->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_c0->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_c0 = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar2->m_enclosingNode).m_ptr = local_98;
  (pNVar2->m_enclosingNode).m_state = pSStack_90;
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_90->strongRefCount = pSStack_90->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar2[1]._vptr_Node = 0;
  pSStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_c0 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar4->m_type = TYPE_VARIABLE;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar4[1]._vptr_Node = 0x25;
  local_d8.m_state = (SharedPtrStateBase *)0x0;
  local_d8.m_ptr = pNVar4;
  local_d8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_d8.m_state)->strongRefCount = 0;
  (local_d8.m_state)->weakRefCount = 0;
  (local_d8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  local_d8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  (local_d8.m_state)->strongRefCount = 1;
  (local_d8.m_state)->weakRefCount = 1;
  (*local_38)(local_48,&local_d8,local_40,PVar5,"unnamed_block");
  if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.m_ptr = (Node *)0x0;
      (*(local_d8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_d8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_d8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_c0->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_c0->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_c0 = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = local_98;
  (pNVar2->m_enclosingNode).m_state = pSStack_90;
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_90->strongRefCount = pSStack_90->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 3;
  pSStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_c0 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar4->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar4[1]._vptr_Node = 1;
  local_d8.m_state = (SharedPtrStateBase *)0x0;
  local_d8.m_ptr = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_d8.m_state = pSVar3;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0x25;
  local_a8.m_state = (SharedPtrStateBase *)0x0;
  local_a8.m_ptr = pNVar2;
  local_a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_a8.m_state)->strongRefCount = 0;
  (local_a8.m_state)->weakRefCount = 0;
  (local_a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  local_a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  (local_a8.m_state)->strongRefCount = 1;
  (local_a8.m_state)->weakRefCount = 1;
  (*local_38)(local_48,&local_a8,local_40,PVar5,"block_array");
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_a8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.m_ptr = (Node *)0x0;
      (*(local_d8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_d8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_d8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_c0->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_c0->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_c0 = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = local_98;
  (pNVar2->m_enclosingNode).m_state = pSStack_90;
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_90->strongRefCount = pSStack_90->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
  pSStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSStack_c0 = pSVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar4->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar4[1]._vptr_Node = 1;
  local_d8.m_state = (SharedPtrStateBase *)0x0;
  local_d8.m_ptr = pNVar4;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_d8.m_state = pSVar3;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar4;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  LOCK();
  pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0x25;
  local_a8.m_state = (SharedPtrStateBase *)0x0;
  local_a8.m_ptr = pNVar2;
  local_a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_a8.m_state)->strongRefCount = 0;
  (local_a8.m_state)->weakRefCount = 0;
  (local_a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  local_a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  (local_a8.m_state)->strongRefCount = 1;
  (local_a8.m_state)->weakRefCount = 1;
  (*local_38)(local_48,&local_a8,local_40,PVar5,"block_array_single_element");
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_a8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.m_ptr = (Node *)0x0;
      (*(local_d8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_d8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_d8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_c0->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_c0->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_c0 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_90->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_98 = (Node *)0x0;
      (*pSStack_90->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_90->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_90 != (SharedPtrStateBase *)0x0) {
        (*pSStack_90->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_90 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_80->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_88 = (Node *)0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_80->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_80 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_70 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_70->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78 = (Node *)0x0;
      (*pSStack_70->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_70->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_70 != (SharedPtrStateBase *)0x0) {
        (*pSStack_70->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_70 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Node *)0x0;
      (*pSStack_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_60 != (SharedPtrStateBase *)0x0) {
        (*pSStack_60->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_50->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_50->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_50 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferBackedInterfaceResourceBasicBlockTypes (Context& context, tcu::TestCaseGroup* targetGroup, glu::GLSLVersion glslVersion, glu::Storage storage, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, ProgramInterface interface, const char* blockName))
{
	const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
	const ResourceDefinition::Node::SharedPtr	shader				(new ResourceDefinition::Shader(program, glu::SHADERTYPE_COMPUTE, glslVersion));
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(shader));
	const ResourceDefinition::Node::SharedPtr	storageQualifier	(new ResourceDefinition::StorageQualifier(defaultBlock, storage));
	const ResourceDefinition::Node::SharedPtr	binding				(new ResourceDefinition::LayoutQualifier(storageQualifier, glu::Layout(-1, 1)));
	const ProgramInterface						programInterface	= (storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) : (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "named_block");
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "unnamed_block");
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array");
	}

	// .block_array_single_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 1));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array_single_element");
	}
}